

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# router.cpp
# Opt level: O1

void clockCMD(packet_t *recv)

{
  pointer pLVar1;
  int iVar2;
  ostream *poVar3;
  mapped_type *pmVar4;
  long *plVar5;
  Link *link;
  pointer neighborDowned;
  
  currentClock = currentClock + 1;
  floodRoutingTablePacket();
  pLVar1 = links.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  for (neighborDowned =
            links.super__Vector_base<Link,_std::allocator<Link>_>._M_impl.super__Vector_impl_data.
            _M_start; neighborDowned != pLVar1; neighborDowned = neighborDowned + 1) {
    if ((3 < currentClock - neighborDowned->recvClock) && (neighborDowned->status == 1)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"----- link down with : ",0x17);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(neighborDowned->neighbor)._M_dataplus._M_p,
                          (neighborDowned->neighbor)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," -----",6);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      neighborDowned->status = 0;
      updateTableForLinkFailure(&neighborDowned->neighbor);
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry>_>_>
               ::operator[](&routingMap_abi_cxx11_,&neighborDowned->neighbor);
      iVar2 = std::__cxx11::string::compare((char *)&pmVar4->nextHop);
      if ((iVar2 != 0) ||
         (pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry>_>_>
                   ::operator[](&routingMap_abi_cxx11_,&neighborDowned->neighbor),
         pmVar4->cost != 0x7fffffff)) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,">> ",3);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cout,(neighborDowned->neighbor)._M_dataplus._M_p,
                            (neighborDowned->neighbor)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," is still connected via ",0x18);
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry>_>_>
                 ::operator[](&routingMap_abi_cxx11_,&neighborDowned->neighbor);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(pmVar4->nextHop)._M_dataplus._M_p,
                            (pmVar4->nextHop)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3," with cost ",0xb);
        pmVar4 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_RoutingTableEntry>_>_>
                 ::operator[](&routingMap_abi_cxx11_,&neighborDowned->neighbor);
        plVar5 = (long *)std::ostream::operator<<((ostream *)poVar3,pmVar4->cost);
        std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
        std::ostream::put((char)plVar5);
        std::ostream::flush();
      }
    }
  }
  return;
}

Assistant:

void clockCMD(const packet_t &recv) {
	currentClock++;
	floodRoutingTablePacket();

	for (auto &link : links) {
		if (currentClock - link.recvClock > 3 && link.status == UP) {
			cout << "----- link down with : " << link.neighbor << " -----" << endl;
			link.status = DOWN;
			updateTableForLinkFailure(link.neighbor);
			if (routingMap[link.neighbor].nextHop != NONE || routingMap[link.neighbor].cost != INF) {
				cout << ">> " << link.neighbor << " is still connected via " << routingMap[link.neighbor].nextHop
				     << " with cost " << routingMap[link.neighbor].cost << endl;
			}
		}
	}
}